

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine.cpp
# Opt level: O2

void __thiscall
QFontEngine::setGlyphCache(QFontEngine *this,void *context,QFontEngineGlyphCache *cache)

{
  _List_node_base *this_00;
  _List_node_base *p_Var1;
  iterator __end1;
  long in_FS_OFFSET;
  GlyphCacheEntry entry;
  GlyphCacheEntry local_30;
  void *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = context;
  this_00 = (_List_node_base *)
            QHash<const_void_*,_std::__cxx11::list<QFontEngine::GlyphCacheEntry,_std::allocator<QFontEngine::GlyphCacheEntry>_>_>
            ::operator[](&this->m_glyphCaches,&local_28);
  p_Var1 = this_00;
  do {
    p_Var1 = (((_List_base<QFontEngine::GlyphCacheEntry,_std::allocator<QFontEngine::GlyphCacheEntry>_>
                *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var1 == this_00) {
      if (this_00[1]._M_next == (_List_node_base *)0x4) {
        std::__cxx11::
        list<QFontEngine::GlyphCacheEntry,_std::allocator<QFontEngine::GlyphCacheEntry>_>::pop_back
                  ((list<QFontEngine::GlyphCacheEntry,_std::allocator<QFontEngine::GlyphCacheEntry>_>
                    *)this_00);
      }
      local_30.cache.d.ptr =
           (QExplicitlySharedDataPointer<QFontEngineGlyphCache>)&DAT_aaaaaaaaaaaaaaaa;
      GlyphCacheEntry::GlyphCacheEntry(&local_30);
      QExplicitlySharedDataPointer<QFontEngineGlyphCache>::reset(&local_30.cache,cache);
      std::__cxx11::
      list<QFontEngine::GlyphCacheEntry,_std::allocator<QFontEngine::GlyphCacheEntry>_>::push_front
                ((list<QFontEngine::GlyphCacheEntry,_std::allocator<QFontEngine::GlyphCacheEntry>_>
                  *)this_00,&local_30);
      GlyphCacheEntry::~GlyphCacheEntry(&local_30);
      break;
    }
  } while ((QFontEngineGlyphCache *)p_Var1[1]._M_next != cache);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFontEngine::setGlyphCache(const void *context, QFontEngineGlyphCache *cache)
{
    Q_ASSERT(cache);

    GlyphCaches &caches = m_glyphCaches[context];
    for (auto & e : caches) {
        if (cache == e.cache.data())
            return;
    }

    // Limit the glyph caches to 4 per context. This covers all 90 degree rotations,
    // and limits memory use when there is continuous or random rotation
    if (caches.size() == 4)
        caches.pop_back();

    GlyphCacheEntry entry;
    entry.cache = cache;
    caches.push_front(entry);

}